

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98player.cpp
# Opt level: O0

UINT8 __thiscall S98Player::LoadTags(S98Player *this)

{
  uint uVar1;
  UINT8 *pUVar2;
  bool bVar3;
  UINT32 UVar4;
  int iVar5;
  mapped_type *this_00;
  pointer ppVar6;
  value_type local_160;
  value_type local_158;
  value_type local_150;
  char **local_148;
  char **t;
  char *tagName;
  char *local_130;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  undefined1 local_118 [8];
  string curKey;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  iterator local_e8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  const_iterator mapIt;
  undefined1 local_a8 [7];
  bool tagIsUTF8;
  string tagData;
  allocator local_71;
  key_type local_70;
  string local_50;
  UINT8 *local_30;
  char *endPtr;
  char *startPtr;
  S98Player *local_18;
  S98Player *this_local;
  
  local_18 = this;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&this->_tagData);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::clear(&this->_tagList);
  startPtr = (char *)0x0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back(&this->_tagList,&startPtr);
  if ((this->_fileHdr).tagOfs == 0) {
    this_local._7_1_ = '\0';
  }
  else {
    uVar1 = (this->_fileHdr).tagOfs;
    UVar4 = DataLoader_GetSize(this->_dLoad);
    if (uVar1 < UVar4) {
      pUVar2 = this->_fileData;
      uVar1 = (this->_fileHdr).tagOfs;
      endPtr = (char *)(pUVar2 + uVar1);
      UVar4 = DataLoader_GetSize(this->_dLoad);
      local_30 = (UINT8 *)memchr(pUVar2 + uVar1,0,(ulong)(UVar4 - (this->_fileHdr).tagOfs));
      if (local_30 == (UINT8 *)0x0) {
        pUVar2 = this->_fileData;
        UVar4 = DataLoader_GetSize(this->_dLoad);
        local_30 = pUVar2 + UVar4;
      }
      if ((this->_fileHdr).fileVer < 3) {
        GetUTF8String_abi_cxx11_(&local_50,this,endPtr,(char *)local_30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_70,"TITLE",&local_71);
        this_00 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&this->_tagData,&local_70);
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::allocator<char>::~allocator((allocator<char> *)&local_71);
        std::__cxx11::string::~string((string *)&local_50);
      }
      else {
        std::__cxx11::string::string((string *)local_a8);
        bVar3 = false;
        if (((long)local_30 - (long)endPtr < 5) || (iVar5 = memcmp(endPtr,"[S98]",5), iVar5 != 0)) {
          emu_logf(&this->_logger,'\x01',"Invalid S98 tag data!\n");
          emu_logf(&this->_logger,'\x04',"tagData size: %zu, Signature: %.5s\n",
                   (long)local_30 - (long)endPtr);
          this_local._7_1_ = 0xf0;
          bVar3 = true;
        }
        else {
          endPtr = endPtr + 5;
          if (2 < (long)local_30 - (long)endPtr) {
            iVar5 = memcmp(endPtr,anon_var_dwarf_34ae3,3);
            bVar3 = iVar5 == 0;
            if (bVar3) {
              endPtr = endPtr + 3;
              emu_logf(&this->_logger,'\x04',"Note: Tags are UTF-8 encoded.\n");
            }
          }
          if (bVar3) {
            std::__cxx11::string::assign<char_const*,void>
                      ((string *)local_a8,endPtr,(char *)local_30);
          }
          else {
            GetUTF8String_abi_cxx11_((string *)&mapIt,this,endPtr,(char *)local_30);
            std::__cxx11::string::operator=((string *)local_a8,(string *)&mapIt);
            std::__cxx11::string::~string((string *)&mapIt);
          }
          ParsePSFTags(this,(string *)local_a8);
          bVar3 = false;
        }
        std::__cxx11::string::~string((string *)local_a8);
        if (bVar3) {
          return this_local._7_1_;
        }
      }
      std::vector<const_char_*,_std::allocator<const_char_*>_>::clear(&this->_tagList);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Rb_tree_const_iterator(&local_d8);
      local_e8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(&this->_tagData);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Rb_tree_const_iterator(&local_e0,&local_e8);
      local_d8._M_node = local_e0._M_node;
      while( true ) {
        curKey.field_2._8_8_ =
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end(&this->_tagData);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_Rb_tree_const_iterator(&local_f0,(iterator *)((long)&curKey.field_2 + 8));
        bVar3 = std::operator!=(&local_d8,&local_f0);
        if (!bVar3) break;
        ppVar6 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_d8);
        std::__cxx11::string::string((string *)local_118,(string *)ppVar6);
        local_120._M_current = (char *)std::__cxx11::string::begin();
        local_128._M_current = (char *)std::__cxx11::string::end();
        local_130 = (char *)std::__cxx11::string::begin();
        tagName = (char *)std::
                          transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                                    (local_120,local_128,
                                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      )local_130,toupper);
        t = (char **)0x0;
        for (local_148 = S98_TAG_MAPPING; *local_148 != (char *)0x0; local_148 = local_148 + 2) {
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_118,*local_148);
          if (bVar3) {
            t = (char **)local_148[1];
            break;
          }
        }
        if (t == (char **)0x0) {
          local_150 = (value_type)std::__cxx11::string::c_str();
          std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                    (&this->_tagList,&local_150);
        }
        else {
          std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                    (&this->_tagList,(value_type *)&t);
        }
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator->(&local_d8);
        local_158 = (value_type)std::__cxx11::string::c_str();
        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                  (&this->_tagList,&local_158);
        std::__cxx11::string::~string((string *)local_118);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator++(&local_d8);
      }
      local_160 = (value_type)0x0;
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                (&this->_tagList,&local_160);
      this_local._7_1_ = '\0';
    }
    else {
      this_local._7_1_ = 0xf3;
    }
  }
  return this_local._7_1_;
}

Assistant:

UINT8 S98Player::LoadTags(void)
{
	_tagData.clear();
	_tagList.clear();
	_tagList.push_back(NULL);
	if (! _fileHdr.tagOfs)
		return 0x00;
	if (_fileHdr.tagOfs >= DataLoader_GetSize(_dLoad))
		return 0xF3;	// tag error (offset out-of-range)
	
	const char* startPtr;
	const char* endPtr;
	
	// find end of string (can be either '\0' or EOF)
	startPtr = (const char*)&_fileData[_fileHdr.tagOfs];
	endPtr = (const char*)memchr(startPtr, '\0', DataLoader_GetSize(_dLoad) - _fileHdr.tagOfs);
	if (endPtr == NULL)
		endPtr = (const char*)_fileData + DataLoader_GetSize(_dLoad);
	
	if (_fileHdr.fileVer < 3)
	{
		// tag offset = song title (\0-terminated)
		_tagData["TITLE"] = GetUTF8String(startPtr, endPtr);
	}
	else
	{
		std::string tagData;
		bool tagIsUTF8 = false;
		
		// tag offset = PSF tag
		if (endPtr - startPtr < 5 || memcmp(startPtr, "[S98]", 5))
		{
			emu_logf(&_logger, PLRLOG_ERROR, "Invalid S98 tag data!\n");
			emu_logf(&_logger, PLRLOG_DEBUG, "tagData size: %zu, Signature: %.5s\n", endPtr - startPtr, startPtr);
			return 0xF0;
		}
		startPtr += 5;
		if (endPtr - startPtr >= 3)
		{
			if (! memcmp(&startPtr[0], "\xEF\xBB\xBF", 3))	// check for UTF-8 BOM
			{
				tagIsUTF8 = true;
				startPtr += 3;
				emu_logf(&_logger, PLRLOG_DEBUG, "Note: Tags are UTF-8 encoded.\n");
			}
		}
		
		if (tagIsUTF8)
			tagData.assign(startPtr, endPtr);
		else
			tagData = GetUTF8String(startPtr, endPtr);
		ParsePSFTags(tagData);
	}
	
	_tagList.clear();
	
	std::map<std::string, std::string>::const_iterator mapIt;
	for (mapIt = _tagData.begin(); mapIt != _tagData.end(); ++ mapIt)
	{
		std::string curKey = mapIt->first;
		std::transform(curKey.begin(), curKey.end(), curKey.begin(), ::toupper);
		
		const char *tagName = NULL;
		for (const char* const* t = S98_TAG_MAPPING; *t != NULL; t += 2)
		{
			if (curKey == t[0])
			{
				tagName = t[1];
				break;
			}
		}
		
		if (tagName)
			_tagList.push_back(tagName);
		else
			_tagList.push_back(curKey.c_str());
		_tagList.push_back(mapIt->second.c_str());
	}
	
	_tagList.push_back(NULL);
	
	return 0x00;
}